

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O1

void FilterLoop24_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  ulong uVar6;
  int iVar7;
  int p0;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  
  if (0 < size) {
    lVar10 = (long)hstride;
    lVar15 = -lVar10;
    iVar7 = size + 1;
    do {
      uVar12 = (ulong)p[lVar10 * -2];
      bVar1 = p[lVar15];
      uVar9 = (ulong)bVar1;
      bVar2 = *p;
      uVar14 = (ulong)bVar2;
      bVar3 = p[lVar10];
      uVar6 = (ulong)bVar3;
      if (((((int)((uint)abs0[(uVar12 - uVar6) + 0xff] + (uint)abs0[(uVar9 - uVar14) + 0xff] * 4) <=
             thresh * 2 + 1) &&
           ((int)(uint)abs0[((ulong)p[hstride * -4] - (ulong)p[lVar10 * -3]) + 0xff] <= ithresh)) &&
          ((int)(uint)abs0[(p[lVar10 * -3] - uVar12) + 0xff] <= ithresh)) &&
         ((((int)(uint)abs0[(uVar12 - uVar9) + 0xff] <= ithresh &&
           ((int)(uint)abs0[((ulong)p[lVar10 * 3] - (ulong)p[lVar10 * 2]) + 0xff] <= ithresh)) &&
          (((int)(uint)abs0[(p[lVar10 * 2] - uVar6) + 0xff] <= ithresh &&
           ((int)(uint)abs0[(uVar6 - uVar14) + 0xff] <= ithresh)))))) {
        uVar8 = (uint)bVar1;
        if (hev_thresh < (int)(uint)abs0[(uVar12 - uVar8) + 0xff]) {
LAB_00115b84:
          iVar13 = ((uint)bVar2 - (uint)bVar1) * 3;
          uVar4 = sclip2[(long)((char)sclip1[(uVar12 - uVar6) + 0x3fc] + iVar13 + 4 >> 3) + 0x70];
          p[lVar15] = ""[(long)(char)sclip2[(long)((char)sclip1[(uVar12 - uVar6) + 0x3fc] + iVar13 +
                                                   3 >> 3) + 0x70] + uVar9 + 0xff];
          iVar13 = (uint)bVar2 - (int)(char)uVar4;
          pbVar11 = p;
        }
        else {
          if (hev_thresh < (int)(uint)abs0[((uint)bVar3 - uVar14) + 0xff]) goto LAB_00115b84;
          pbVar11 = p + lVar10;
          uVar4 = sclip2[(long)((int)((bVar2 - uVar8) * 3 + 4) >> 3) + 0x70];
          uVar5 = sclip2[(long)((int)((bVar2 - uVar8) * 3 + 3) >> 3) + 0x70];
          iVar13 = (char)uVar4 + 1 >> 1;
          p[lVar10 * -2] = ""[uVar12 + (long)iVar13 + 0xff];
          p[lVar15] = ""[(ulong)uVar8 + (long)(char)uVar5 + 0xff];
          *p = ""[(uVar14 - (long)(char)uVar4) + 0xff];
          iVar13 = (uint)bVar3 - iVar13;
        }
        *pbVar11 = ""[(long)iVar13 + 0xff];
      }
      p = p + vstride;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop24_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter4_C(p, hstride);
      }
    }
    p += vstride;
  }
}